

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

bool ON_SubD::AutomaticMeshToSubD(AutomaticMeshToSubDContext context)

{
  undefined1 local_a;
  bool bAutomaticallyCreateSubD;
  AutomaticMeshToSubDContext context_local;
  
  if (context == Unset) {
    local_a = 0;
  }
  else if (context == Rhino5BoxModeTSpline) {
    local_a = AutomaticRhino5BoxModeTSplineToSubD;
  }
  else if (context == FBXMeshWithDivisionLevels) {
    local_a = AutomaticFBXMeshWithDivisionLevelsToSubD;
  }
  else {
    local_a = 0;
  }
  return (bool)local_a;
}

Assistant:

bool ON_SubD::AutomaticMeshToSubD(
  ON_SubD::AutomaticMeshToSubDContext context
)
{
  bool bAutomaticallyCreateSubD;
  switch (context)
  {
  case ON_SubD::AutomaticMeshToSubDContext::Unset:
    bAutomaticallyCreateSubD = false;
    break;
  case ON_SubD::AutomaticMeshToSubDContext::Rhino5BoxModeTSpline:
    bAutomaticallyCreateSubD = ON_SubD::AutomaticRhino5BoxModeTSplineToSubD;
    break;
  case ON_SubD::AutomaticMeshToSubDContext::FBXMeshWithDivisionLevels:
    bAutomaticallyCreateSubD = ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubD;
    break;
  default:
    bAutomaticallyCreateSubD = false;
    break;
  }
  return bAutomaticallyCreateSubD;
}